

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpge.cpp
# Opt level: O0

int __thiscall jpge::jpeg_encoder::init(jpeg_encoder *this,EVP_PKEY_CTX *ctx)

{
  undefined2 uVar1;
  bool bVar2;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 uVar3;
  int in_ECX;
  int in_EDX;
  int in_R8D;
  jpeg_encoder *in_R9;
  jpeg_encoder *pjVar4;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  pjVar4 = this;
  deinit(in_R9);
  uVar3 = extraout_var;
  if ((((ctx != (EVP_PKEY_CTX *)0x0) && (0 < in_EDX)) && (0 < in_ECX)) &&
     (((in_R8D == 1 || (in_R8D == 3)) || (in_R8D == 4)))) {
    bVar2 = jpge::params::check((params *)in_R9);
    uVar3 = extraout_var_00;
    if (bVar2) {
      this->m_pStream = (output_stream *)ctx;
      *(output_stream **)&this->m_params = in_R9->m_pStream;
      uVar1 = (undefined2)(in_R9->m_params).m_quality;
      (this->m_params).m_no_chroma_discrim_flag = (bool)(char)uVar1;
      (this->m_params).m_two_pass_flag = (bool)(char)((ushort)uVar1 >> 8);
      bVar2 = jpg_open((jpeg_encoder *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8)
                       ,(int)((ulong)pjVar4 >> 0x20),(int)pjVar4,(int)((ulong)ctx >> 0x20));
      uVar3 = extraout_var_01;
      goto LAB_00150ef5;
    }
  }
  bVar2 = false;
LAB_00150ef5:
  return (int)CONCAT71(uVar3,bVar2);
}

Assistant:

bool jpeg_encoder::init(output_stream* pStream, int width, int height, int src_channels, const params& comp_params) {
  deinit();
  if (((!pStream) || (width < 1) || (height < 1)) || ((src_channels != 1) && (src_channels != 3) && (src_channels != 4)) || (!comp_params.check()))
    return false;
  m_pStream = pStream;
  m_params = comp_params;
  return jpg_open(width, height, src_channels);
}